

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O0

int teardown_roaring_add_offset_test(void **state_)

{
  long lVar1;
  long *in_RDI;
  roaring_add_offset_test_state_t *state;
  
  lVar1 = *in_RDI;
  if (*(long *)(lVar1 + 0x20) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x1034d0);
    *(undefined8 *)(lVar1 + 0x20) = 0;
  }
  if (*(long *)(lVar1 + 0x28) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x1034f7);
    *(undefined8 *)(lVar1 + 0x28) = 0;
  }
  if (*(long *)(lVar1 + 0x30) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x10351e);
    *(undefined8 *)(lVar1 + 0x30) = 0;
  }
  if (*(long *)(lVar1 + 0x38) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x103545);
    *(undefined8 *)(lVar1 + 0x38) = 0;
  }
  if (*(long *)(lVar1 + 0x40) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x10356c);
    *(undefined8 *)(lVar1 + 0x40) = 0;
  }
  return 0;
}

Assistant:

static int teardown_roaring_add_offset_test(void **state_) {
    roaring_add_offset_test_state_t *state =
        *(roaring_add_offset_test_state_t **)state_;
    if (state->in) {
        roaring_bitmap_free(state->in);
        state->in = NULL;
    }
    if (state->forward) {
        roaring_bitmap_free(state->forward);
        state->forward = NULL;
    }
    if (state->back) {
        roaring_bitmap_free(state->back);
        state->back = NULL;
    }
    if (state->neg_forward) {
        roaring_bitmap_free(state->neg_forward);
        state->neg_forward = NULL;
    }
    if (state->neg_back) {
        roaring_bitmap_free(state->neg_back);
        state->neg_back = NULL;
    }

    return 0;
}